

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  byte local_15;
  Limit local_14;
  bool result;
  CodedInputStream *pCStack_10;
  Limit limit_local;
  CodedInputStream *this_local;
  
  local_14 = limit;
  pCStack_10 = this;
  local_15 = ConsumedEntireMessage(this);
  PopLimit(this,local_14);
  local_51 = 0;
  if (this->recursion_limit_ <= this->recursion_budget_) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x9e);
    local_51 = 1;
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (recursion_budget_) < (recursion_limit_): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  this->recursion_budget_ = this->recursion_budget_ + 1;
  return (bool)(local_15 & 1);
}

Assistant:

bool CodedInputStream::DecrementRecursionDepthAndPopLimit(Limit limit) {
  bool result = ConsumedEntireMessage();
  PopLimit(limit);
  GOOGLE_DCHECK_LT(recursion_budget_, recursion_limit_);
  ++recursion_budget_;
  return result;
}